

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O2

bool __thiscall
kmp_flag_64::wait_cancellable_nosleep
          (kmp_flag_64 *this,kmp_info_t *this_thr,int final_spin,void *itt_sync_obj)

{
  atomic<int> *paVar1;
  kmp_int32 kVar2;
  int iVar3;
  unsigned_long_long *puVar4;
  ompt_lw_taskteam_t *poVar5;
  int iVar6;
  kmp_task_team_t *pkVar7;
  kmp_uint32 local_5c;
  ompt_state_t local_4c;
  int local_48;
  int local_44;
  void *local_40;
  ompt_data_t *local_38;
  
  puVar4 = (this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc;
  local_40 = itt_sync_obj;
  if (final_spin == 0) {
    local_44 = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      local_5c = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar6 = 0;
      while (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
              super_kmp_flag_native<unsigned_long_long>.loc !=
             (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014337e:
          pkVar7 = (kmp_task_team_t *)0x0;
        }
        else {
          pkVar7 = (this_thr->th).th_task_team;
          if (pkVar7 == (kmp_task_team_t *)0x0) {
            (this_thr->th).th_reap_state = 1;
            goto LAB_0014337e;
          }
          if ((pkVar7->tt).tt_active == 0) {
            (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_0014338b:
            (this_thr->th).th_reap_state = 1;
          }
          else {
            if ((pkVar7->tt).tt_found_tasks != 1) goto LAB_0014338b;
            __kmp_execute_tasks_64(this_thr,kVar2,this,0,&local_44,local_40,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar6 < __kmp_itt_prepare_delay)) &&
           (iVar6 = iVar6 + 1, __kmp_itt_prepare_delay <= iVar6)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar4);
        }
        if (__kmp_global.g.g_done != 0) {
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
          break;
        }
        if (__kmp_use_yield - 1U < 2) {
          iVar3 = __kmp_avail_proc;
          if (__kmp_avail_proc == 0) {
            iVar3 = __kmp_xproc;
          }
          if (iVar3 < __kmp_nth) {
            __kmp_yield();
          }
          else if ((__kmp_use_yield == 1) && (local_5c = local_5c - 2, local_5c == 0)) {
            __kmp_yield();
            local_5c = __kmp_yield_next;
          }
        }
        if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
           ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1))
        break;
        if (((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
           ((pkVar7 == (kmp_task_team_t *)0x0 || ((pkVar7->tt).tt_found_tasks == 0)))) {
          __kmp_hardware_timestamp();
        }
      }
      if (((ompt_enabled._0_1_ & 1) != 0) && (*(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar6 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      goto joined_r0x0014352a;
    }
  }
  else {
    local_48 = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      this_thr->th_pad[0x548] = '\x01';
      if ((ompt_enabled._0_1_ & 1) != 0) {
        local_4c = *(ompt_state_t *)(this_thr->th_pad + 0x160);
        if ((local_4c == ompt_state_wait_barrier_implicit) &&
           (*(int *)(this_thr->th_pad + 0x20) != 0)) {
          local_38 = (ompt_data_t *)(this_thr->th_pad + 0x150);
        }
        else {
          poVar5 = (((this_thr->th).th_team)->t).ompt_serialized_team_info;
          if (poVar5 == (ompt_lw_taskteam_t *)0x0) {
            local_38 = &(((this_thr->th).th_current_task)->ompt_task_info).task_data;
          }
          else {
            local_38 = &(poVar5->ompt_task_info).task_data;
          }
        }
        if ((__kmp_tasking_mode == tskm_immediate_exec) ||
           ((this_thr->th).th_task_team == (kmp_task_team_t *)0x0)) {
          __ompt_implicit_task_end(this_thr,local_4c,local_38);
        }
      }
      local_5c = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar6 = 0;
      while (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
              super_kmp_flag_native<unsigned_long_long>.loc !=
             (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014362e:
          pkVar7 = (kmp_task_team_t *)0x0;
        }
        else {
          pkVar7 = (this_thr->th).th_task_team;
          if (pkVar7 == (kmp_task_team_t *)0x0) {
            (this_thr->th).th_reap_state = 1;
            goto LAB_0014362e;
          }
          if ((pkVar7->tt).tt_active == 0) {
            if ((ompt_enabled._0_1_ & 1) != 0) {
              __ompt_implicit_task_end(this_thr,local_4c,local_38);
            }
            (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_00143658:
            (this_thr->th).th_reap_state = 1;
          }
          else {
            if ((pkVar7->tt).tt_found_tasks != 1) goto LAB_00143658;
            __kmp_execute_tasks_64(this_thr,kVar2,this,1,&local_48,local_40,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar6 < __kmp_itt_prepare_delay)) &&
           (iVar6 = iVar6 + 1, __kmp_itt_prepare_delay <= iVar6)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar4);
        }
        if (__kmp_global.g.g_done != 0) {
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
          break;
        }
        if (__kmp_use_yield - 1U < 2) {
          iVar3 = __kmp_avail_proc;
          if (__kmp_avail_proc == 0) {
            iVar3 = __kmp_xproc;
          }
          if (iVar3 < __kmp_nth) {
            __kmp_yield();
          }
          else if ((__kmp_use_yield == 1) && (local_5c = local_5c - 2, local_5c == 0)) {
            __kmp_yield();
            local_5c = __kmp_yield_next;
          }
        }
        if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
           ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1))
        break;
        if (((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
           ((pkVar7 == (kmp_task_team_t *)0x0 || ((pkVar7->tt).tt_found_tasks == 0)))) {
          __kmp_hardware_timestamp();
        }
      }
      if (((*(ompt_state_t *)(this_thr->th_pad + 0x160) != ompt_state_undefined & ompt_enabled._0_1_
           ) == 1) &&
         (__ompt_implicit_task_end(this_thr,*(ompt_state_t *)(this_thr->th_pad + 0x160),local_38),
         *(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      this_thr->th_pad[0x548] = '\0';
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar6 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      local_44 = local_48;
joined_r0x0014352a:
      if (iVar6 != 1) {
        return false;
      }
      if (local_44 != 0) {
        LOCK();
        paVar1 = &(((this_thr->th).th_task_team)->tt).tt_unfinished_threads;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        return true;
      }
      return true;
    }
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
    (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
  }
  return false;
}

Assistant:

bool wait_cancellable_nosleep(kmp_info_t *this_thr,
                                int final_spin
                                    USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    bool retval = false;
    if (final_spin)
      retval = __kmp_wait_template<kmp_flag_64, TRUE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      retval = __kmp_wait_template<kmp_flag_64, FALSE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    return retval;
  }